

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void checkList(IntegrityCk *pCheck,int isFreeList,int iPage,int N)

{
  uint uVar1;
  u8 *p;
  int iVar2;
  u32 uVar3;
  u32 uVar4;
  BtShared *pBVar5;
  ulong uVar6;
  uint uVar7;
  u8 *p_00;
  bool bVar8;
  DbPage *pOvflPage;
  
  uVar4 = iPage;
  uVar7 = N;
  while( true ) {
    if ((int)uVar7 < 1) {
      return;
    }
    if (pCheck->mxErr == 0) {
      return;
    }
    if ((int)uVar4 < 1) {
      checkAppendMsg(pCheck,"%d of %d pages missing from overflow list starting at %d",(ulong)uVar7,
                     (ulong)(uint)N,(ulong)(uint)iPage);
      return;
    }
    iVar2 = checkRef(pCheck,uVar4);
    if (iVar2 != 0) break;
    iVar2 = (*pCheck->pPager->xGet)(pCheck->pPager,uVar4,&pOvflPage,0);
    if (iVar2 != 0) {
      checkAppendMsg(pCheck,"failed to get page %d",(ulong)uVar4);
      return;
    }
    uVar1 = uVar7 - 1;
    p = (u8 *)pOvflPage->pData;
    if (isFreeList == 0) {
      bVar8 = uVar7 != 1;
      uVar7 = uVar1;
      if ((bVar8) && (pCheck->pBt->autoVacuum != '\0')) {
        uVar3 = sqlite3Get4byte(p);
        checkPtrmap(pCheck,uVar3,'\x04',uVar4);
      }
    }
    else {
      uVar3 = sqlite3Get4byte(p + 4);
      pBVar5 = pCheck->pBt;
      if (pBVar5->autoVacuum != '\0') {
        checkPtrmap(pCheck,uVar4,'\x02',0);
        pBVar5 = pCheck->pBt;
      }
      if ((int)pBVar5->usableSize / 4 + -2 < (int)uVar3) {
        checkAppendMsg(pCheck,"freelist leaf count too big on page %d",(ulong)uVar4);
        uVar7 = uVar7 - 2;
      }
      else {
        p_00 = p + 8;
        uVar6 = 0;
        if (0 < (int)uVar3) {
          uVar6 = (ulong)uVar3;
        }
        while (bVar8 = uVar6 != 0, uVar6 = uVar6 - 1, bVar8) {
          uVar4 = sqlite3Get4byte(p_00);
          if (pCheck->pBt->autoVacuum != '\0') {
            checkPtrmap(pCheck,uVar4,'\x02',0);
          }
          checkRef(pCheck,uVar4);
          p_00 = p_00 + 4;
        }
        uVar7 = uVar1 - uVar3;
      }
    }
    uVar4 = sqlite3Get4byte(p);
    sqlite3PagerUnref(pOvflPage);
    if ((isFreeList != 0) && ((int)uVar7 < (int)(uint)(uVar4 != 0))) {
      checkAppendMsg(pCheck,"free-page count in header is too small");
    }
  }
  return;
}

Assistant:

static void checkList(
  IntegrityCk *pCheck,  /* Integrity checking context */
  int isFreeList,       /* True for a freelist.  False for overflow page list */
  int iPage,            /* Page number for first page in the list */
  int N                 /* Expected number of pages in the list */
){
  int i;
  int expected = N;
  int iFirst = iPage;
  while( N-- > 0 && pCheck->mxErr ){
    DbPage *pOvflPage;
    unsigned char *pOvflData;
    if( iPage<1 ){
      checkAppendMsg(pCheck,
         "%d of %d pages missing from overflow list starting at %d",
          N+1, expected, iFirst);
      break;
    }
    if( checkRef(pCheck, iPage) ) break;
    if( sqlite3PagerGet(pCheck->pPager, (Pgno)iPage, &pOvflPage, 0) ){
      checkAppendMsg(pCheck, "failed to get page %d", iPage);
      break;
    }
    pOvflData = (unsigned char *)sqlite3PagerGetData(pOvflPage);
    if( isFreeList ){
      int n = get4byte(&pOvflData[4]);
#ifndef SQLITE_OMIT_AUTOVACUUM
      if( pCheck->pBt->autoVacuum ){
        checkPtrmap(pCheck, iPage, PTRMAP_FREEPAGE, 0);
      }
#endif
      if( n>(int)pCheck->pBt->usableSize/4-2 ){
        checkAppendMsg(pCheck,
           "freelist leaf count too big on page %d", iPage);
        N--;
      }else{
        for(i=0; i<n; i++){
          Pgno iFreePage = get4byte(&pOvflData[8+i*4]);
#ifndef SQLITE_OMIT_AUTOVACUUM
          if( pCheck->pBt->autoVacuum ){
            checkPtrmap(pCheck, iFreePage, PTRMAP_FREEPAGE, 0);
          }
#endif
          checkRef(pCheck, iFreePage);
        }
        N -= n;
      }
    }
#ifndef SQLITE_OMIT_AUTOVACUUM
    else{
      /* If this database supports auto-vacuum and iPage is not the last
      ** page in this overflow list, check that the pointer-map entry for
      ** the following page matches iPage.
      */
      if( pCheck->pBt->autoVacuum && N>0 ){
        i = get4byte(pOvflData);
        checkPtrmap(pCheck, i, PTRMAP_OVERFLOW2, iPage);
      }
    }
#endif
    iPage = get4byte(pOvflData);
    sqlite3PagerUnref(pOvflPage);

    if( isFreeList && N<(iPage!=0) ){
      checkAppendMsg(pCheck, "free-page count in header is too small");
    }
  }
}